

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

int __thiscall QHeaderView::logicalIndex(QHeaderView *this,int visualIndex)

{
  long lVar1;
  int iVar2;
  
  iVar2 = -1;
  if (-1 < visualIndex) {
    lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
    if (*(int *)(lVar1 + 0x650) == 0) {
      iVar2 = -1;
      if (visualIndex < *(int *)(lVar1 + 0x658)) {
        iVar2 = visualIndex;
      }
      return iVar2;
    }
    if (visualIndex < *(int *)(lVar1 + 0x648)) {
      if (*(long *)(lVar1 + 0x580) == 0) {
        return visualIndex;
      }
      iVar2 = *(int *)(*(long *)(lVar1 + 0x578) + (ulong)(uint)visualIndex * 4);
    }
  }
  return iVar2;
}

Assistant:

int QHeaderView::logicalIndex(int visualIndex) const
{
    Q_D(const QHeaderView);
    if (visualIndex < 0 || visualIndex >= d->sectionCount())
        return -1;

    if (d->noSectionMemoryUsage())
        return visualIndex;

    return d->logicalIndex(visualIndex);
}